

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.c
# Opt level: O0

void read_shape(shape_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  shape_t *record_local;
  
  init_shape(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"shape_id");
    if (iVar1 == 0) {
      strcpy(record->id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"shape_pt_lat");
      if (iVar1 == 0) {
        dVar3 = strtod(field_values[local_2c],(char **)0x0);
        record->pt_lat = (longdouble)dVar3;
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"shape_pt_lon");
        if (iVar1 == 0) {
          dVar3 = strtod(field_values[local_2c],(char **)0x0);
          record->pt_lon = (longdouble)dVar3;
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"shape_pt_sequence");
          if (iVar1 == 0) {
            uVar2 = strtoul(field_values[local_2c],(char **)0x0,0);
            record->pt_sequence = (uint)uVar2;
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"shape_dist_traveled");
            if (iVar1 == 0) {
              dVar3 = strtod(field_values[local_2c],(char **)0x0);
              record->dist_traveled = dVar3;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_shape(shape_t *record, int field_count, const char **field_names, const char **field_values) {
    init_shape(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "shape_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "shape_pt_lat") == 0) {
            record->pt_lat = strtod(field_values[i], NULL);  // TODO: strtold not working, figure out why
            continue;
        }
        if (strcmp(field_names[i], "shape_pt_lon") == 0) {
            record->pt_lon = strtod(field_values[i], NULL);  // TODO: same as record->c:26
            continue;
        }
        if (strcmp(field_names[i], "shape_pt_sequence") == 0) {
            record->pt_sequence = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "shape_dist_traveled") == 0) {
            record->dist_traveled = strtod(field_values[i], NULL);
            continue;
        }
    }
}